

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O2

void __thiscall CoreML::Specification::Imputer::set_imputedstringvalue(Imputer *this,string *value)

{
  if (this->_oneof_case_[0] != 3) {
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 3;
    (this->ImputedValue_).imputeddoublearray_ =
         (DoubleVector *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this->ImputedValue_).imputedstringvalue_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,value);
  return;
}

Assistant:

inline void Imputer::set_imputedstringvalue(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.Imputer.imputedStringValue)
  if (!has_imputedstringvalue()) {
    clear_ImputedValue();
    set_has_imputedstringvalue();
    ImputedValue_.imputedstringvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  ImputedValue_.imputedstringvalue_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.Imputer.imputedStringValue)
}